

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  byte bVar2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar3;
  byte *pbVar4;
  Ch *pCVar5;
  double dVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  double *pdVar12;
  char *pcVar13;
  ulong i;
  Ch *pCVar14;
  byte bVar15;
  ulong uVar16;
  uint i_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar17;
  int iVar18;
  byte *pbVar19;
  byte *pbVar20;
  int iVar21;
  uint uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  bVar2 = *is->src_;
  if (bVar2 < 0x6e) {
    if (bVar2 == 0x22) {
      ParseString<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler,false);
      return;
    }
    if (bVar2 == 0x66) {
      pCVar5 = is->src_;
      pCVar14 = pCVar5 + 1;
      is->src_ = pCVar14;
      if (pCVar5[1] == 'a') {
        pCVar14 = pCVar5 + 2;
        is->src_ = pCVar14;
        if (pCVar5[2] == 'l') {
          pCVar14 = pCVar5 + 3;
          is->src_ = pCVar14;
          if (pCVar5[3] == 's') {
            pCVar14 = pCVar5 + 4;
            is->src_ = pCVar14;
            if (pCVar5[4] == 'e') {
              is->src_ = pCVar5 + 5;
              pcVar13 = (handler->stack_).stackTop_;
              if ((long)(handler->stack_).stackEnd_ - (long)pcVar13 < 0x10) {
                internal::Stack<rapidjson::CrtAllocator>::
                Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
                pcVar13 = (handler->stack_).stackTop_;
              }
              (handler->stack_).stackTop_ = pcVar13 + 0x10;
              pcVar13[0] = '\0';
              pcVar13[1] = '\0';
              pcVar13[2] = '\0';
              pcVar13[3] = '\0';
              pcVar13[4] = '\0';
              pcVar13[5] = '\0';
              pcVar13[6] = '\0';
              pcVar13[7] = '\0';
              pcVar13[8] = '\0';
              pcVar13[9] = '\0';
              pcVar13[10] = '\0';
              pcVar13[0xb] = '\0';
              pcVar13[0xc] = '\0';
              pcVar13[0xd] = '\0';
              pcVar13[0xe] = '\0';
              pcVar13[0xf] = '\0';
              pcVar13[0xe] = '\t';
              pcVar13[0xf] = '\0';
              return;
            }
          }
        }
      }
      pCVar5 = is->head_;
      *(undefined4 *)(this + 0x30) = 3;
      *(long *)(this + 0x38) = (long)pCVar14 - (long)pCVar5;
      return;
    }
    if (bVar2 != 0x5b) {
      ParseNumber<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler);
      return;
    }
    is->src_ = is->src_ + 1;
    bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::StartArray(handler);
    if (bVar9) {
      SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(this,is)
      ;
      if (*(int *)(this + 0x30) == 0) {
        if (*is->src_ == ']') {
          is->src_ = is->src_ + 1;
          pcVar13 = (handler->stack_).stackTop_;
          pcVar13[-8] = '\0';
          pcVar13[-7] = '\0';
          pcVar13[-6] = '\0';
          pcVar13[-5] = '\0';
          pcVar13[-4] = '\0';
          pcVar13[-3] = '\0';
          pcVar13[-2] = '\x04';
          pcVar13[-1] = '\0';
          pcVar13[-0x10] = '\0';
          pcVar13[-0xf] = '\0';
          pcVar13[-0xe] = '\0';
          pcVar13[-0xd] = '\0';
          pcVar13[-0xc] = '\0';
          pcVar13[-0xb] = '\0';
          pcVar13[-10] = '\0';
          pcVar13[-9] = '\0';
        }
        else {
          uVar22 = 0;
          do {
            ParseValue<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                      (this,is);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pcVar13 = is->src_;
            if (*pcVar13 != ',') {
              if (*pcVar13 == ']') {
                is->src_ = pcVar13 + 1;
                uVar22 = uVar22 + 1;
                pMVar3 = handler->allocator_;
                pcVar13 = (handler->stack_).stackTop_;
                pGVar17 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)(pcVar13 + (ulong)uVar22 * -0x10);
                (handler->stack_).stackTop_ = (char *)pGVar17;
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::SetArrayRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)(pcVar13 + (ulong)uVar22 * -0x10 + -0x10),pGVar17,uVar22,pMVar3);
                return;
              }
              lVar11 = (long)pcVar13 - (long)is->head_;
              *(undefined4 *)(this + 0x30) = 7;
              goto LAB_00139300;
            }
            is->src_ = pcVar13 + 1;
            SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                      (this,is);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            uVar22 = uVar22 + 1;
          } while (*is->src_ != ']');
          pMVar3 = handler->allocator_;
          pcVar13 = (handler->stack_).stackTop_;
          pGVar17 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)(pcVar13 + (ulong)uVar22 * -0x10);
          (handler->stack_).stackTop_ = (char *)pGVar17;
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::SetArrayRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)(pcVar13 + (ulong)uVar22 * -0x10 + -0x10),pGVar17,uVar22,pMVar3);
          is->src_ = is->src_ + 1;
        }
      }
    }
    else {
      lVar11 = (long)is->src_ - (long)is->head_;
      *(undefined4 *)(this + 0x30) = 0x10;
LAB_00139300:
      *(long *)(this + 0x38) = lVar11;
    }
    return;
  }
  if (bVar2 == 0x6e) {
    pCVar5 = is->src_;
    pCVar14 = pCVar5 + 1;
    is->src_ = pCVar14;
    if (pCVar5[1] == 'u') {
      pCVar14 = pCVar5 + 2;
      is->src_ = pCVar14;
      if (pCVar5[2] == 'l') {
        pCVar14 = pCVar5 + 3;
        is->src_ = pCVar14;
        if (pCVar5[3] == 'l') {
          is->src_ = pCVar5 + 4;
          pcVar13 = (handler->stack_).stackTop_;
          if ((long)(handler->stack_).stackEnd_ - (long)pcVar13 < 0x10) {
            internal::Stack<rapidjson::CrtAllocator>::
            Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                      (&handler->stack_,1);
            pcVar13 = (handler->stack_).stackTop_;
          }
          (handler->stack_).stackTop_ = pcVar13 + 0x10;
          pcVar13[0] = '\0';
          pcVar13[1] = '\0';
          pcVar13[2] = '\0';
          pcVar13[3] = '\0';
          pcVar13[4] = '\0';
          pcVar13[5] = '\0';
          pcVar13[6] = '\0';
          pcVar13[7] = '\0';
          pcVar13[8] = '\0';
          pcVar13[9] = '\0';
          pcVar13[10] = '\0';
          pcVar13[0xb] = '\0';
          pcVar13[0xc] = '\0';
          pcVar13[0xd] = '\0';
          pcVar13[0xe] = '\0';
          pcVar13[0xf] = '\0';
          return;
        }
      }
    }
    pCVar5 = is->head_;
    *(undefined4 *)(this + 0x30) = 3;
    *(long *)(this + 0x38) = (long)pCVar14 - (long)pCVar5;
    return;
  }
  if (bVar2 == 0x74) {
    pCVar5 = is->src_;
    pCVar14 = pCVar5 + 1;
    is->src_ = pCVar14;
    if (pCVar5[1] == 'r') {
      pCVar14 = pCVar5 + 2;
      is->src_ = pCVar14;
      if (pCVar5[2] == 'u') {
        pCVar14 = pCVar5 + 3;
        is->src_ = pCVar14;
        if (pCVar5[3] == 'e') {
          is->src_ = pCVar5 + 4;
          pcVar13 = (handler->stack_).stackTop_;
          if ((long)(handler->stack_).stackEnd_ - (long)pcVar13 < 0x10) {
            internal::Stack<rapidjson::CrtAllocator>::
            Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                      (&handler->stack_,1);
            pcVar13 = (handler->stack_).stackTop_;
          }
          (handler->stack_).stackTop_ = pcVar13 + 0x10;
          pcVar13[0] = '\0';
          pcVar13[1] = '\0';
          pcVar13[2] = '\0';
          pcVar13[3] = '\0';
          pcVar13[4] = '\0';
          pcVar13[5] = '\0';
          pcVar13[6] = '\0';
          pcVar13[7] = '\0';
          pcVar13[8] = '\0';
          pcVar13[9] = '\0';
          pcVar13[10] = '\0';
          pcVar13[0xb] = '\0';
          pcVar13[0xc] = '\0';
          pcVar13[0xd] = '\0';
          pcVar13[0xe] = '\0';
          pcVar13[0xf] = '\0';
          pcVar13[0xe] = '\n';
          pcVar13[0xf] = '\0';
          return;
        }
      }
    }
    pCVar5 = is->head_;
    *(undefined4 *)(this + 0x30) = 3;
    *(long *)(this + 0x38) = (long)pCVar14 - (long)pCVar5;
    return;
  }
  if (bVar2 == 0x7b) {
    ParseObject<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pbVar4 = (byte *)is->src_;
  bVar2 = *pbVar4;
  pbVar20 = pbVar4;
  bVar15 = bVar2;
  if (bVar2 == 0x2d) {
    pbVar20 = pbVar4 + 1;
    bVar15 = pbVar4[1];
  }
  pCVar14 = is->head_;
  if (bVar15 == 0x30) {
    uVar22 = (uint)pbVar20[1];
    pbVar19 = pbVar20 + 1;
    dVar6 = 0.0;
    bVar9 = false;
    i = 0;
    bVar8 = false;
    iVar10 = 0;
    bVar7 = false;
    i_00 = 0;
    goto LAB_001395ea;
  }
  if ((byte)(bVar15 - 0x31) < 9) {
    i_00 = bVar15 - 0x30;
    bVar15 = pbVar20[1];
    uVar16 = (ulong)bVar15;
    pbVar19 = pbVar20 + 1;
    dVar6 = 0.0;
    if (bVar2 == 0x2d) {
      if ((byte)(bVar15 - 0x30) < 10) {
        iVar10 = 0;
LAB_0013945e:
        if (i_00 < 0xccccccc) {
LAB_00139466:
          i_00 = (i_00 * 10 + (int)uVar16) - 0x30;
          iVar10 = iVar10 + 1;
          bVar15 = pbVar19[1];
          uVar16 = (ulong)bVar15;
          pbVar19 = pbVar19 + 1;
          if (9 < (byte)(bVar15 - 0x30)) goto LAB_00139532;
          goto LAB_0013945e;
        }
        if (i_00 != 0xccccccc) goto LAB_001394d5;
        if ((byte)uVar16 < 0x39) goto LAB_00139466;
        i_00 = 0xccccccc;
        uVar16 = 0x39;
LAB_001394d5:
        i = (ulong)i_00;
        if (bVar2 == 0x2d) {
          do {
            if ((0xccccccccccccccb < i) && (0x38 < (byte)uVar16 || i != 0xccccccccccccccc))
            goto LAB_00139582;
            i = (uVar16 & 0xf) + i * 10;
            iVar10 = iVar10 + 1;
            bVar15 = pbVar19[1];
            uVar16 = (ulong)bVar15;
            pbVar19 = pbVar19 + 1;
          } while ((byte)(bVar15 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < i) && (0x35 < (byte)uVar16 || i != 0x1999999999999999))
            goto LAB_00139582;
            i = (uVar16 & 0xf) + i * 10;
            iVar10 = iVar10 + 1;
            bVar15 = pbVar19[1];
            uVar16 = (ulong)bVar15;
            pbVar19 = pbVar19 + 1;
          } while ((byte)(bVar15 - 0x30) < 10);
        }
        uVar22 = (uint)bVar15;
        dVar6 = 0.0;
        bVar7 = true;
        bVar9 = false;
        bVar8 = false;
        goto LAB_001395ea;
      }
LAB_001399ab:
      iVar10 = 0;
    }
    else {
      if (9 < (byte)(bVar15 - 0x30)) goto LAB_001399ab;
      iVar10 = 0;
      do {
        if (0x19999998 < i_00) {
          if (i_00 != 0x19999999) goto LAB_001394d5;
          if (0x35 < (byte)uVar16) {
            i_00 = 0x19999999;
            goto LAB_001394d5;
          }
        }
        i_00 = (i_00 * 10 + (int)uVar16) - 0x30;
        iVar10 = iVar10 + 1;
        bVar15 = pbVar19[1];
        uVar16 = (ulong)bVar15;
        pbVar19 = pbVar19 + 1;
      } while ((byte)(bVar15 - 0x30) < 10);
    }
LAB_00139532:
    uVar22 = (uint)bVar15;
    i = 0;
    bVar8 = false;
    bVar9 = false;
    bVar7 = false;
    goto LAB_001395ea;
  }
  lVar11 = (long)pbVar20 - (long)pCVar14;
  *(undefined4 *)(this + 0x30) = 3;
LAB_00139813:
  *(long *)(this + 0x38) = lVar11;
LAB_00139995:
  is->src_ = (Ch *)pbVar20;
  is->head_ = pCVar14;
  return;
LAB_00139582:
  auVar24._8_4_ = (int)(i >> 0x20);
  auVar24._0_8_ = i;
  auVar24._12_4_ = 0x45300000;
  dVar6 = (auVar24._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  do {
    dVar6 = (double)((int)uVar16 + -0x30) + dVar6 * 10.0;
    bVar15 = pbVar19[1];
    uVar16 = (ulong)bVar15;
    uVar22 = (uint)bVar15;
    pbVar19 = pbVar19 + 1;
  } while ((byte)(bVar15 - 0x30) < 10);
  bVar9 = true;
  bVar8 = true;
  bVar7 = true;
LAB_001395ea:
  if ((char)uVar22 != '.') {
    iVar18 = 0;
LAB_0013972b:
    iVar10 = 0;
    if ((uVar22 | 0x20) != 0x65) goto LAB_0013987b;
    uVar16 = (ulong)i_00;
    if (bVar7) {
      uVar16 = i;
    }
    if (!bVar8) {
      auVar26._8_4_ = (int)(uVar16 >> 0x20);
      auVar26._0_8_ = uVar16;
      auVar26._12_4_ = 0x45300000;
      dVar6 = (auVar26._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0);
      bVar8 = true;
    }
    bVar15 = pbVar19[1];
    bVar9 = bVar15 != 0x2b;
    if ((bVar9) && (bVar15 != 0x2d)) {
      if (9 < (byte)(bVar15 - 0x30)) {
        pbVar20 = pbVar19 + 1;
LAB_00139801:
        lVar11 = (long)pbVar20 - (long)pCVar14;
        *(undefined4 *)(this + 0x30) = 0xf;
        goto LAB_00139813;
      }
      pbVar19 = pbVar19 + 2;
      iVar21 = bVar15 - 0x30;
    }
    else {
      pbVar20 = pbVar19 + 2;
      if (9 < (byte)(*pbVar20 - 0x30)) {
        pbVar20 = pbVar19 + 2;
        goto LAB_00139801;
      }
      pbVar19 = pbVar19 + 3;
      iVar21 = *pbVar20 - 0x30;
      if (bVar15 != 0x2b) {
        bVar15 = *pbVar19;
        if ((byte)(bVar15 - 0x30) < 10) {
          do {
            iVar21 = iVar21 * 10 + (uint)bVar15 + -0x30;
            if ((iVar18 + 0x7ffffff7) / 10 < iVar21) goto LAB_001397ee;
            pbVar19 = pbVar19 + 1;
            bVar15 = *pbVar19;
          } while ((byte)(bVar15 - 0x30) < 10);
        }
        else {
          bVar9 = true;
        }
        goto LAB_0013986e;
      }
    }
    do {
      bVar15 = *pbVar19;
      if (9 < (byte)(bVar15 - 0x30)) {
        bVar9 = false;
        goto LAB_0013986e;
      }
      pbVar19 = pbVar19 + 1;
      iVar21 = iVar21 * 10 + (uint)bVar15 + -0x30;
    } while (iVar21 <= 0x134 - iVar18);
LAB_00139945:
    *(undefined4 *)(this + 0x30) = 0xd;
    goto LAB_00139951;
  }
  uVar22 = (uint)pbVar19[1];
  pbVar20 = pbVar19 + 1;
  if (0xf5 < (byte)(pbVar19[1] - 0x3a)) {
    iVar18 = 0;
    if (bVar9) {
LAB_00139698:
      do {
        pbVar19 = pbVar20;
        if (0x39 < (byte)uVar22) goto LAB_0013972b;
        if (iVar10 < 0x11) {
          dVar6 = (double)(int)(uVar22 - 0x30) + dVar6 * 10.0;
          iVar18 = iVar18 + -1;
          if (0.0 < dVar6) {
            iVar10 = iVar10 + 1;
          }
        }
        pbVar1 = pbVar20 + 1;
        uVar22 = (uint)*pbVar1;
        pbVar19 = pbVar20 + 1;
        pbVar20 = pbVar19;
      } while ('/' < (char)*pbVar1);
      iVar10 = 0;
      goto LAB_0013987b;
    }
    if (!bVar7) {
      i = (ulong)i_00;
    }
    iVar18 = 0;
    do {
      if ((0x39 < (byte)uVar22) || (i >> 0x35 != 0)) {
        auVar25._8_4_ = (int)(i >> 0x20);
        auVar25._0_8_ = i;
        auVar25._12_4_ = 0x45300000;
        dVar6 = (auVar25._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
        bVar8 = true;
        goto LAB_00139698;
      }
      pbVar19 = pbVar20 + 1;
      iVar18 = iVar18 + -1;
      i = (ulong)(uVar22 - 0x30) + i * 10;
      iVar10 = iVar10 + (uint)(i != 0);
      pbVar1 = pbVar20 + 1;
      uVar22 = (uint)*pbVar1;
      pbVar20 = pbVar19;
    } while ('/' < (char)*pbVar1);
    dVar6 = (double)(long)i;
    iVar10 = 0;
    goto LAB_00139880;
  }
  lVar11 = (long)pbVar20 - (long)pCVar14;
  *(undefined4 *)(this + 0x30) = 0xe;
  goto LAB_00139813;
LAB_001397ee:
  do {
    pbVar20 = pbVar19 + 1;
    pbVar19 = pbVar19 + 1;
  } while ((byte)(*pbVar20 - 0x30) < 10);
LAB_0013986e:
  iVar10 = -iVar21;
  if (!bVar9) {
    iVar10 = iVar21;
  }
LAB_0013987b:
  if (bVar8) {
LAB_00139880:
    uVar22 = iVar10 + iVar18;
    if ((int)uVar22 < -0x134) {
      dVar23 = 0.0;
      if (0xfffffd97 < uVar22) {
        dVar23 = dVar6 / (*(double *)(internal::Pow10(int)::e + (ulong)(-uVar22 - 0x134) * 8) *
                         1e+308);
        goto LAB_00139937;
      }
    }
    else {
      if ((int)uVar22 < 0) {
        dVar23 = dVar6 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar22 * 8);
      }
      else {
        dVar23 = dVar6 * *(double *)(internal::Pow10(int)::e + (ulong)uVar22 * 8);
      }
LAB_00139937:
      if (1.79769313486232e+308 < dVar23) goto LAB_00139945;
    }
    if (bVar2 == 0x2d) {
      dVar23 = -dVar23;
    }
    pdVar12 = (double *)(handler->stack_).stackTop_;
    if ((long)(handler->stack_).stackEnd_ - (long)pdVar12 < 0x10) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&handler->stack_,1);
      pdVar12 = (double *)(handler->stack_).stackTop_;
    }
    (handler->stack_).stackTop_ = (char *)(pdVar12 + 2);
    pdVar12[1] = 1.3140351748525322e-298;
    *pdVar12 = dVar23;
    pbVar20 = pbVar19;
    goto LAB_00139995;
  }
  if (bVar7) {
    if (bVar2 == 0x2d) {
      bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Int64(handler,-i);
    }
    else {
      bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Uint64(handler,i);
    }
  }
  else if (bVar2 == 0x2d) {
    bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Int(handler,-i_00);
  }
  else {
    bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Uint(handler,i_00);
  }
  pbVar20 = pbVar19;
  if (bVar9 != false) goto LAB_00139995;
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_00139951:
  *(long *)(this + 0x38) = (long)pbVar4 - (long)pCVar14;
  pbVar20 = pbVar19;
  goto LAB_00139995;
}

Assistant:

Ch Peek() const { return *src_; }